

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

int mp_check(char **data,char *end)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  byte *pbVar5;
  ushort uVar6;
  ulong uVar7;
  
  pbVar5 = (byte *)*data;
  lVar4 = 1;
  do {
    if (lVar4 < 1) {
      if (pbVar5 <= end) {
        return 0;
      }
      __assert_fail("*data <= end",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                    ,0xa2b,"int mp_check(const char **, const char *)");
    }
    if (pbVar5 == (byte *)end) {
      return 1;
    }
    bVar2 = *pbVar5;
    pbVar1 = pbVar5 + 1;
    *data = (char *)pbVar1;
    bVar2 = ""[bVar2];
    uVar7 = (ulong)(char)bVar2;
    if (-1 < (long)uVar7) {
      if ((ulong)((long)end - (long)pbVar1) < uVar7) {
        return 1;
      }
      *data = (char *)(pbVar1 + uVar7);
      pbVar5 = pbVar1 + uVar7;
      goto LAB_00106979;
    }
    if (0xe0 < bVar2) {
      lVar4 = lVar4 - uVar7;
      pbVar5 = pbVar1;
      goto LAB_00106979;
    }
    switch(bVar2) {
    case 0xd7:
      if ((ulong)((long)end - (long)pbVar1) < 5) {
        return 1;
      }
      uVar3 = *(uint *)(pbVar5 + 1);
      uVar7 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                     uVar3 << 0x18);
      pbVar5 = pbVar5 + 6;
      break;
    case 0xd8:
      if ((ulong)((long)end - (long)pbVar1) < 3) {
        return 1;
      }
      uVar6 = *(ushort *)(pbVar5 + 1) << 8 | *(ushort *)(pbVar5 + 1) >> 8;
      pbVar5 = pbVar5 + 4;
      goto LAB_00106af6;
    case 0xd9:
      if ((ulong)((long)end - (long)pbVar1) < 2) {
        return 1;
      }
      uVar7 = (ulong)pbVar5[1];
      pbVar5 = pbVar5 + 3;
      break;
    case 0xda:
      if ((ulong)((long)end - (long)pbVar1) < 4) {
        return 1;
      }
      uVar3 = *(uint *)(pbVar5 + 1);
      pbVar5 = pbVar5 + 5;
      *data = (char *)pbVar5;
      uVar7 = (ulong)((uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                      uVar3 << 0x18) * 2);
      goto LAB_00106ad7;
    case 0xdb:
      if ((ulong)((long)end - (long)pbVar1) < 2) {
        return 1;
      }
      uVar6 = *(ushort *)(pbVar5 + 1);
      pbVar5 = pbVar5 + 3;
      *data = (char *)pbVar5;
      lVar4 = lVar4 + (ulong)(ushort)(uVar6 << 8 | uVar6 >> 8) * 2;
      goto LAB_00106979;
    case 0xdc:
      if ((ulong)((long)end - (long)pbVar1) < 4) {
        return 1;
      }
      uVar3 = *(uint *)(pbVar5 + 1);
      uVar7 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                     uVar3 << 0x18);
      pbVar5 = pbVar5 + 5;
      *data = (char *)pbVar5;
      goto LAB_00106ad7;
    case 0xdd:
      if ((ulong)((long)end - (long)pbVar1) < 2) {
        return 1;
      }
      uVar6 = *(ushort *)(pbVar5 + 1);
      pbVar5 = pbVar5 + 3;
      *data = (char *)pbVar5;
      uVar7 = (ulong)(ushort)(uVar6 << 8 | uVar6 >> 8);
LAB_00106ad7:
      lVar4 = lVar4 + uVar7;
      goto LAB_00106979;
    case 0xde:
      if ((ulong)((long)end - (long)pbVar1) < 4) {
        return 1;
      }
      uVar3 = *(uint *)(pbVar5 + 1);
      uVar7 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                     uVar3 << 0x18);
      pbVar5 = pbVar5 + 5;
      break;
    case 0xdf:
      if ((ulong)((long)end - (long)pbVar1) < 2) {
        return 1;
      }
      uVar6 = *(ushort *)(pbVar5 + 1) << 8 | *(ushort *)(pbVar5 + 1) >> 8;
      pbVar5 = pbVar5 + 3;
LAB_00106af6:
      *data = (char *)pbVar5;
      uVar7 = (ulong)uVar6;
      goto LAB_00106b03;
    case 0xe0:
      if (pbVar1 == (byte *)end) {
        return 1;
      }
      uVar7 = (ulong)pbVar5[1];
      pbVar5 = pbVar5 + 2;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                    ,0xa27,"int mp_check(const char **, const char *)");
    }
    *data = (char *)pbVar5;
LAB_00106b03:
    if ((ulong)((long)end - (long)pbVar5) < uVar7) {
      return 1;
    }
    pbVar5 = pbVar5 + uVar7;
    *data = (char *)pbVar5;
LAB_00106979:
    lVar4 = lVar4 + -1;
  } while( true );
}

Assistant:

MP_IMPL int
mp_check(const char **data, const char *end)
{
#define MP_CHECK_LEN(_l) \
	if (mp_unlikely((size_t)(end - *data) < (size_t)(_l))) \
		return 1;

	int64_t k;
	for (k = 1; k > 0; k--) {
		MP_CHECK_LEN(1);
		uint8_t c = mp_load_u8(data);
		int l = mp_parser_hint[c];
		if (mp_likely(l >= 0)) {
			MP_CHECK_LEN(l);
			*data += l;
			continue;
		} else if (mp_likely(l > MP_HINT)) {
			k -= l;
			continue;
		}

		uint32_t len;
		switch (l) {
		case MP_HINT_STR_8:
			/* MP_STR (8) */
			MP_CHECK_LEN(sizeof(uint8_t));
			len = mp_load_u8(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_STR_16:
			/* MP_STR (16) */
			MP_CHECK_LEN(sizeof(uint16_t));
			len = mp_load_u16(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_STR_32:
			/* MP_STR (32) */
			MP_CHECK_LEN(sizeof(uint32_t))
			len = mp_load_u32(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_ARRAY_16:
			/* MP_ARRAY (16) */
			MP_CHECK_LEN(sizeof(uint16_t));
			k += mp_load_u16(data);
			break;
		case MP_HINT_ARRAY_32:
			/* MP_ARRAY (32) */
			MP_CHECK_LEN(sizeof(uint32_t));
			k += mp_load_u32(data);
			break;
		case MP_HINT_MAP_16:
			/* MP_MAP (16) */
			MP_CHECK_LEN(sizeof(uint16_t));
			k += 2 * mp_load_u16(data);
			break;
		case MP_HINT_MAP_32:
			/* MP_MAP (32) */
			MP_CHECK_LEN(sizeof(uint32_t));
			k += 2 * mp_load_u32(data);
			break;
		case MP_HINT_EXT_8:
			/* MP_EXT (8) */
			MP_CHECK_LEN(sizeof(uint8_t) + sizeof(uint8_t));
			len = mp_load_u8(data);
			mp_load_u8(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_EXT_16:
			/* MP_EXT (16) */
			MP_CHECK_LEN(sizeof(uint16_t) + sizeof(uint8_t));
			len = mp_load_u16(data);
			mp_load_u8(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_EXT_32:
			/* MP_EXT (32) */
			MP_CHECK_LEN(sizeof(uint32_t) + sizeof(uint8_t));
			len = mp_load_u32(data);
			mp_load_u8(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		default:
			mp_unreachable();
		}
	}

	assert(*data <= end);
#undef MP_CHECK_LEN
	return 0;
}